

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capnp.c++
# Opt level: O0

Validity * __thiscall
capnp::compiler::CompilerMain::addSource
          (Validity *__return_storage_ptr__,CompilerMain *this,StringPtr file)

{
  StringPtr pathStr;
  int iVar1;
  Compiler *pCVar2;
  uint64_t id;
  undefined4 extraout_var;
  PathPtr path_00;
  StringPtr pathStr_00;
  SourceFile local_140;
  undefined1 auStack_108 [8];
  ModuleScope compiled;
  Module *module;
  ModuleLoader local_d8;
  Module *_module370;
  char *pcStack_c0;
  undefined1 local_b8 [8];
  DirPathPair dirPathPair;
  ReadableDirectory *dir;
  undefined1 local_80 [16];
  ReadableDirectory *_dir359;
  StringPtr path;
  StringPtr *__end3;
  StringPtr *__begin3;
  StringPtr (*__range3) [3];
  Own<capnp::compiler::Compiler,_std::nullptr_t> local_38;
  undefined8 local_28;
  CompilerMain *this_local;
  StringPtr file_local;
  
  file_local.content.ptr = (char *)file.content.size_;
  this_local = (CompilerMain *)file.content.ptr;
  local_28 = this;
  file_local.content.size_ = (size_t)__return_storage_ptr__;
  if ((this->compilerConstructed & 1U) == 0) {
    kj::SpaceFor<capnp::compiler::Compiler>::construct<capnp::compiler::Compiler::AnnotationFlag&>
              ((SpaceFor<capnp::compiler::Compiler> *)&local_38,
               (AnnotationFlag *)&this->compilerSpace);
    kj::Own<capnp::compiler::Compiler,_std::nullptr_t>::operator=(&this->compiler,&local_38);
    kj::Own<capnp::compiler::Compiler,_std::nullptr_t>::~Own(&local_38);
    this->compilerConstructed = true;
  }
  if ((this->addStandardImportPaths & 1U) != 0) {
    path.content.size_ = (size_t)&kj::DestructorOnlyDisposer<capnp::compiler::Compiler>::vtable;
    for (__end3 = addSource::STANDARD_IMPORT_PATHS; __end3 != (StringPtr *)path.content.size_;
        __end3 = __end3 + 1) {
      _dir359 = (ReadableDirectory *)(__end3->content).ptr;
      path.content.ptr = (char *)(__end3->content).size_;
      pathStr_00.content.size_ = (size_t)_dir359;
      pathStr_00.content.ptr = (char *)this;
      getSourceDirectory((CompilerMain *)local_80,pathStr_00,SUB81(path.content.ptr,0));
      local_80._8_8_ =
           kj::_::readMaybe<kj::ReadableDirectory_const>
                     ((Maybe<const_kj::ReadableDirectory_&> *)local_80);
      if ((ArrayDisposer *)local_80._8_8_ != (ArrayDisposer *)0x0) {
        dirPathPair.path.parts.disposer = (ArrayDisposer *)local_80._8_8_;
        ModuleLoader::addImportPath(&this->loader,(ReadableDirectory *)local_80._8_8_);
      }
    }
    this->addStandardImportPaths = false;
  }
  _module370 = (Module *)this_local;
  pcStack_c0 = file_local.content.ptr;
  pathStr.content.size_ = (size_t)file_local.content.ptr;
  pathStr.content.ptr = (char *)this_local;
  interpretSourceFile((DirPathPair *)local_b8,this,pathStr);
  kj::PathPtr::PathPtr((PathPtr *)&module,(Path *)&dirPathPair);
  path_00.parts.size_ = (size_t)module;
  path_00.parts.ptr = (String *)local_b8;
  ModuleLoader::loadModule(&local_d8,(ReadableDirectory *)&this->loader,path_00);
  local_d8.impl.ptr =
       (Impl *)kj::_::readMaybe<capnp::compiler::Module>
                         ((Maybe<capnp::compiler::Module_&> *)&local_d8);
  if ((Node *)local_d8.impl.ptr == (Node *)0x0) {
    kj::MainBuilder::Validity::Validity(__return_storage_ptr__,"no such file");
  }
  else {
    compiled.node = (Node *)local_d8.impl.ptr;
    pCVar2 = kj::Own<capnp::compiler::Compiler,_std::nullptr_t>::operator->(&this->compiler);
    Compiler::add((ModuleScope *)auStack_108,pCVar2,(Module *)compiled.node);
    pCVar2 = kj::Own<capnp::compiler::Compiler,_std::nullptr_t>::operator->(&this->compiler);
    id = Compiler::ModuleScope::getId((ModuleScope *)auStack_108);
    Compiler::eagerlyCompile(pCVar2,id,this->compileEagerness);
    local_140.id = Compiler::ModuleScope::getId((ModuleScope *)auStack_108);
    local_140.compiled.node = (Node *)compiled.id;
    local_140.compiled.compiler._0_4_ = auStack_108._0_4_;
    local_140.compiled.compiler._4_4_ = auStack_108._4_4_;
    local_140.compiled.id._0_4_ = compiled.compiler._0_4_;
    local_140.compiled.id._4_4_ = compiled.compiler._4_4_;
    iVar1 = (*((compiled.node)->super_Resolver)._vptr_Resolver[3])();
    local_140.name.content.ptr = (char *)CONCAT44(extraout_var,iVar1);
    local_140.module = (Module *)compiled.node;
    kj::Vector<capnp::compiler::CompilerMain::SourceFile>::
    add<capnp::compiler::CompilerMain::SourceFile>(&this->sourceFiles,&local_140);
    kj::MainBuilder::Validity::Validity(__return_storage_ptr__,true);
  }
  DirPathPair::~DirPathPair((DirPathPair *)local_b8);
  return __return_storage_ptr__;
}

Assistant:

kj::MainBuilder::Validity addSource(kj::StringPtr file) {
    if (!compilerConstructed) {
      compiler = compilerSpace.construct(annotationFlag);
      compilerConstructed = true;
    }

    if (addStandardImportPaths) {
      static constexpr kj::StringPtr STANDARD_IMPORT_PATHS[] = {
        "/usr/local/include"_kj,
        "/usr/include"_kj,
#ifdef CAPNP_INCLUDE_DIR
        KJ_CONCAT(CAPNP_INCLUDE_DIR, _kj),
#endif
      };
      for (auto path: STANDARD_IMPORT_PATHS) {
        KJ_IF_SOME(dir, getSourceDirectory(path, false)) {
          loader.addImportPath(dir);
        } else {
          // ignore standard path that doesn't exist
        }
      }

      addStandardImportPaths = false;
    }

    auto dirPathPair = interpretSourceFile(file);
    KJ_IF_SOME(module, loader.loadModule(dirPathPair.dir, dirPathPair.path)) {
      auto compiled = compiler->add(module);
      compiler->eagerlyCompile(compiled.getId(), compileEagerness);
      sourceFiles.add(SourceFile { compiled.getId(), compiled, module.getSourceName(), &module });
    } else {
      return "no such file";
    }